

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_5c268::MapDriver::reset(MapDriver *this)

{
  int iVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float in_XMM1_Da;
  float fVar2;
  
  OpenSteer::SimpleVehicle::reset(&this->super_SimpleVehicle);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1c])(0,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x21])(0x41a00000,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x20])(this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1f])(extraout_XMM0_Da * 0.4,this);
  this->halfWidth = 1.0;
  this->halfLength = 1.5;
  adjustVehicleRadiusForSpeed(this);
  fVar2 = OpenSteer::Vec3::zero.y;
  (this->annotateAvoid).x = OpenSteer::Vec3::zero.x;
  (this->annotateAvoid).y = fVar2;
  (this->annotateAvoid).z = OpenSteer::Vec3::zero.z;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  setTrailParameters((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,(this->super_SimpleVehicle).super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .trailDuration,
                     (this->super_SimpleVehicle).super_SimpleVehicle_3.
                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
                     trailVertexCount);
  this->stuck = false;
  fVar2 = OpenSteer::Vec3::zero.y;
  (this->qqqLastNearestObstacle).x = OpenSteer::Vec3::zero.x;
  (this->qqqLastNearestObstacle).y = fVar2;
  (this->qqqLastNearestObstacle).z = OpenSteer::Vec3::zero.z;
  this->baseLookAheadTime = 3.0;
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    this->lapsStarted = this->lapsStarted + 1;
    iVar1 = this->pathFollowDirection;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])
              ((float)iVar1 * 200.0 * 0.6,0xc2a00000,this);
    in_XMM1_Da = (float)iVar1 * OpenSteer::Vec3::side.x;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[0x11])(this);
  }
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(this);
  fVar2 = in_XMM1_Da;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[6])(this);
  (this->super_SimpleVehicle)._smoothedPosition.x =
       extraout_XMM0_Da_01 * -80.0 + extraout_XMM0_Da_00;
  (this->super_SimpleVehicle)._smoothedPosition.y = extraout_XMM0_Db_00 * -80.0 + extraout_XMM0_Db;
  (this->super_SimpleVehicle)._smoothedPosition.z = fVar2 * -80.0 + in_XMM1_Da;
  fVar2 = OpenSteer::Vec3::zero.y;
  (this->currentSteering).x = OpenSteer::Vec3::zero.x;
  (this->currentSteering).y = fVar2;
  (this->currentSteering).z = OpenSteer::Vec3::zero.z;
  this->dtZero = false;
  this->QQQoaJustScraping = false;
  return;
}

Assistant:

void reset (void)
        {
            // reset the underlying vehicle class
            SimpleVehicle::reset ();

            // initially stopped
            setSpeed (0);

            // Assume top speed is 20 meters per second (44.7 miles per hour).
            // This value will eventually be supplied by a higher level module.
            setMaxSpeed (20);

            // steering force is clipped to this magnitude
            setMaxForce (maxSpeed () * 0.4f);

            // vehicle is 2 meters wide and 3 meters long
            halfWidth = 1.0f;
            halfLength = 1.5f;

            // init dynamically controlled radius
            adjustVehicleRadiusForSpeed ();

            // not previously avoiding
            annotateAvoid = Vec3::zero;

            // prevent long streaks due to teleportation 
            clearTrailHistory ();

            // first pass at detecting "stuck" state
            stuck = false;

            // QQQ need to clean up this hack
            qqqLastNearestObstacle = Vec3::zero;

            // master look ahead (prediction) time
            baseLookAheadTime = 3;

            if (demoSelect == 2)
            {
                lapsStarted++;
                const float s = worldSize;
                const float d = (float) pathFollowDirection;
                setPosition (Vec3 (s * d * 0.6f, 0, s * -0.4f));
                regenerateOrthonormalBasisUF (Vec3::side * d);
            }

            // reset bookeeping to detect stuck cycles
            resetStuckCycleDetection ();

            // assume no previous steering
            currentSteering = Vec3::zero;

            // assume normal running state
            dtZero = false;

            // QQQ temporary global QQQoaJustScraping
            QQQoaJustScraping = false;

            // state saved for speedometer
    //      annoteMaxRelSpeed = annoteMaxRelSpeedCurve = annoteMaxRelSpeedPath = 0;
    //      annoteMaxRelSpeed = annoteMaxRelSpeedCurve = annoteMaxRelSpeedPath = 1;
        }